

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int stbtt_GetNumberOfFonts(uchar *data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = stbtt__isfont(data);
  uVar2 = 1;
  if (iVar1 == 0) {
    uVar3 = 0;
    uVar2 = 0;
    if ((((*data == 't') && (uVar2 = uVar3, data[1] == 't')) && (data[2] == 'c')) &&
       (data[3] == 'f')) {
      uVar3 = *(uint *)(data + 4);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if ((uVar3 == 0x20000) || (uVar3 == 0x10000)) {
        uVar2 = *(uint *)(data + 8);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
    }
  }
  return uVar2;
}

Assistant:

STBTT_DEF int stbtt_GetNumberOfFonts(const unsigned char *data)
{
return stbtt_GetNumberOfFonts_internal((unsigned char *) data);
}